

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

cargo_validation_t *
cargo_validate_choices(cargo_validate_choices_flags_t flags,cargo_type_t type,size_t count,...)

{
  int iVar1;
  uint uVar2;
  char in_AL;
  cargo_validation_t *user;
  cargo_validation_t *pcVar3;
  cargo_validation_destroy_f p_Var4;
  undefined8 *puVar5;
  char *pcVar6;
  double *pdVar7;
  undefined4 *puVar8;
  undefined8 in_RCX;
  ulong uVar9;
  undefined8 uVar10;
  undefined8 in_R8;
  undefined8 in_R9;
  cargo_validation_f p_Var11;
  undefined4 in_XMM0_Da;
  undefined4 uVar12;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  cargo_astr_t str;
  double local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  str.offset = 0;
  str.diff = 0;
  str.s = (char **)0x0;
  str.l = 0;
  p_Var11 = (cargo_validation_f)0x1;
  local_e8[3] = (double)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  user = (cargo_validation_t *)_cargo_calloc(1,0x38);
  if (user != (cargo_validation_t *)0x0) {
    pcVar3 = cargo_create_validator
                       ("choices",_cargo_validate_choices_cb,_cargo_validate_choices_destroy_cb,
                        CARGO_ULONGLONG|CARGO_LONGLONG|CARGO_STRING|CARGO_DOUBLE|CARGO_FLOAT|
                        CARGO_UINT|CARGO_INT,user);
    if (pcVar3 != (cargo_validation_t *)0x0) {
      *(cargo_validate_choices_flags_t *)&user->user = flags;
      *(cargo_type_t *)&user->name = type;
      user->validator = (cargo_validation_f)count;
      p_Var4 = (cargo_validation_destroy_f)_cargo_calloc(count,8);
      if (type == CARGO_STRING) {
        user->destroy = p_Var4;
      }
      else {
        *(cargo_validation_destroy_f *)&user->types = p_Var4;
      }
      if (p_Var4 != (cargo_validation_destroy_f)0x0) {
        str.s = &user[1].name;
        str.l = count * 0x14;
        ap[0].gp_offset = 0x18;
        ap[0].fp_offset = 0x30;
        ap[0].overflow_arg_area = &stack0x00000008;
        if (((ulong)user->user & 2) == 0) {
          uStack_b4 = 0x3c32725d;
          uVar12 = 0xd1d243ac;
        }
        else {
          ap[0].gp_offset = 0x18;
          ap[0].fp_offset = 0x40;
          uVar12 = local_b8;
        }
        user->ref_count = CONCAT44(uStack_b4,uVar12);
        do {
          if (user->validator <= p_Var11 + -1) {
            return pcVar3;
          }
          iVar1 = *(int *)&user->name;
          if (iVar1 == 2) {
            uVar9 = ap[0]._0_8_ & 0xffffffff;
            if (uVar9 < 0x29) {
              ap[0].gp_offset = ap[0].gp_offset + 8;
              puVar8 = (undefined4 *)((long)local_e8 + uVar9);
            }
            else {
              puVar8 = (undefined4 *)ap[0].overflow_arg_area;
              ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
            }
            *(undefined4 *)(*(long *)&user->types + -8 + (long)p_Var11 * 8) = *puVar8;
            uVar2 = *(uint *)(*(long *)&user->types + -8 + (long)p_Var11 * 8);
            pcVar6 = "%d";
LAB_0010919d:
            cargo_aappendf(&str,pcVar6,(ulong)uVar2);
          }
          else {
            if (iVar1 == 4) {
              uVar9 = ap[0]._0_8_ & 0xffffffff;
              if (uVar9 < 0x29) {
                ap[0].gp_offset = ap[0].gp_offset + 8;
                puVar8 = (undefined4 *)((long)local_e8 + uVar9);
              }
              else {
                puVar8 = (undefined4 *)ap[0].overflow_arg_area;
                ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
              }
              *(undefined4 *)(*(long *)&user->types + -8 + (long)p_Var11 * 8) = *puVar8;
              uVar2 = *(uint *)(*(long *)&user->types + -8 + (long)p_Var11 * 8);
              pcVar6 = "%u";
              goto LAB_0010919d;
            }
            if (iVar1 == 8) {
              uVar9 = (ulong)ap[0].fp_offset;
              if (uVar9 < 0xa1) {
                ap[0].fp_offset = ap[0].fp_offset + 0x10;
                pdVar7 = (double *)((long)local_e8 + uVar9);
              }
              else {
                pdVar7 = (double *)ap[0].overflow_arg_area;
                ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
              }
              *(float *)(*(long *)&user->types + -8 + (long)p_Var11 * 8) = (float)*pdVar7;
              uVar12 = SUB84((double)*(float *)(*(long *)&user->types + -8 + (long)p_Var11 * 8),0);
LAB_00109162:
              cargo_aappendf(&str,"%.2f",uVar12);
            }
            else {
              if (iVar1 == 0x10) {
                uVar9 = (ulong)ap[0].fp_offset;
                if (uVar9 < 0xa1) {
                  ap[0].fp_offset = ap[0].fp_offset + 0x10;
                  puVar5 = (undefined8 *)((long)local_e8 + uVar9);
                }
                else {
                  puVar5 = (undefined8 *)ap[0].overflow_arg_area;
                  ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
                }
                *(undefined8 *)(*(long *)&user->types + -8 + (long)p_Var11 * 8) = *puVar5;
                uVar12 = (undefined4)*(undefined8 *)(*(long *)&user->types + -8 + (long)p_Var11 * 8)
                ;
                goto LAB_00109162;
              }
              if (iVar1 == 0x80) {
                uVar9 = ap[0]._0_8_ & 0xffffffff;
                if (uVar9 < 0x29) {
                  ap[0].gp_offset = ap[0].gp_offset + 8;
                  puVar5 = (undefined8 *)((long)local_e8 + uVar9);
                }
                else {
                  puVar5 = (undefined8 *)ap[0].overflow_arg_area;
                  ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
                }
                *(undefined8 *)(*(long *)&user->types + -8 + (long)p_Var11 * 8) = *puVar5;
                uVar10 = *(undefined8 *)(*(long *)&user->types + -8 + (long)p_Var11 * 8);
                pcVar6 = "%llu";
LAB_00109131:
                cargo_aappendf(&str,pcVar6,uVar10);
              }
              else {
                if (iVar1 == 0x40) {
                  uVar9 = ap[0]._0_8_ & 0xffffffff;
                  if (uVar9 < 0x29) {
                    ap[0].gp_offset = ap[0].gp_offset + 8;
                    puVar5 = (undefined8 *)((long)local_e8 + uVar9);
                  }
                  else {
                    puVar5 = (undefined8 *)ap[0].overflow_arg_area;
                    ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
                  }
                  *(undefined8 *)(*(long *)&user->types + -8 + (long)p_Var11 * 8) = *puVar5;
                  uVar10 = *(undefined8 *)(*(long *)&user->types + -8 + (long)p_Var11 * 8);
                  pcVar6 = "%lld";
                  goto LAB_00109131;
                }
                if (iVar1 == 0x20) {
                  uVar9 = ap[0]._0_8_ & 0xffffffff;
                  if (uVar9 < 0x29) {
                    ap[0].gp_offset = ap[0].gp_offset + 8;
                    puVar5 = (undefined8 *)((long)local_e8 + uVar9);
                  }
                  else {
                    puVar5 = (undefined8 *)ap[0].overflow_arg_area;
                    ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
                  }
                  pcVar6 = _cargo_strdup((char *)*puVar5);
                  *(char **)(user->destroy + (long)p_Var11 * 8 + -8) = pcVar6;
                  if (pcVar6 != (char *)0x0) {
                    uVar10 = *(undefined8 *)(user->destroy + (long)p_Var11 * 8 + -8);
                    pcVar6 = "%s";
                    goto LAB_00109131;
                  }
                  break;
                }
              }
            }
          }
          if (p_Var11 < user->validator) {
            cargo_aappendf(&str,", ");
          }
          p_Var11 = p_Var11 + 1;
        } while( true );
      }
      _cargo_xfree(&user->destroy);
      _cargo_xfree(&user->types);
      _cargo_xfree(user + 1);
      _cargo_free(user);
      user = pcVar3;
    }
    _cargo_free(user);
  }
  return (cargo_validation_t *)0x0;
}

Assistant:

cargo_validation_t *cargo_validate_choices(cargo_validate_choices_flags_t flags,
                                            cargo_type_t type,
                                            size_t count, ...)
{
    va_list ap;
    size_t i;
    cargo_astr_t str;
    cargo_validation_t *v = NULL;
    cargo_choices_validation_t *vc = NULL;
    memset(&str, 0, sizeof(str));

    if (!(vc = _cargo_calloc(1, sizeof(cargo_choices_validation_t))))
    {
        return NULL;
    }

    if (!(v = cargo_create_validator("choices",
                _cargo_validate_choices_cb,
                _cargo_validate_choices_destroy_cb,
                (CARGO_STRING | CARGO_INT | CARGO_UINT | CARGO_FLOAT |
                 CARGO_DOUBLE | CARGO_LONGLONG | CARGO_ULONGLONG),
                vc)))
    {
        _cargo_free(vc);
        return NULL;
    }

    vc->flags = flags;
    vc->type = type;
    vc->count = count;

    if (vc->type == CARGO_STRING)
    {
        if (!(vc->strs = _cargo_calloc(vc->count, sizeof(char *))))
        {
            CARGODBG(1, "Out of memory\n");
            goto fail;
        }
    }
    else
    {
        if (!(vc->nums = _cargo_calloc(vc->count, sizeof(cargo_vals_t))))
        {
            CARGODBG(1, "Out of memory\n");
            goto fail;
        }
    }

    // Start out with room strings of 20 chars
    // to keep reallocation to a minimum.
    str.s = &vc->err;
    str.l = count * 20;

    va_start(ap, count);

    if (vc->flags & CARGO_VALIDATE_CHOICES_SET_EPSILON)
    {
        vc->epsilon = va_arg(ap, double);
    }
    else
    {
        vc->epsilon = CARGO_DEFAULT_EPSILON;
    }

    for (i = 0; i < vc->count; i++)
    {
        switch (vc->type)
        {
            case CARGO_STRING:
            {
                if (!(vc->strs[i] = _cargo_strdup(va_arg(ap, char *))))
                {
                    goto fail;
                }

                cargo_aappendf(&str, "%s", vc->strs[i]);
                break;
            }
            case CARGO_INT:
            {
                vc->nums[i].i = va_arg(ap, int);
                cargo_aappendf(&str, "%d", vc->nums[i].i);
                break;
            }
            case CARGO_UINT:
            {
                vc->nums[i].u = va_arg(ap, unsigned int);
                cargo_aappendf(&str, "%u", vc->nums[i].u);
                break;
            }
            case CARGO_FLOAT:
            {
                vc->nums[i].f = (float)va_arg(ap, double);
                cargo_aappendf(&str, "%.2f", vc->nums[i].f);
                break;
            }
            case CARGO_DOUBLE:
            {
                vc->nums[i].d = va_arg(ap, double);
                cargo_aappendf(&str, "%.2f", vc->nums[i].d);
                break;
            }
            case CARGO_LONGLONG:
            {
                vc->nums[i].ll = va_arg(ap, long long int);
                cargo_aappendf(&str, "%"CARGO_LONGLONG_FMT, vc->nums[i].ll);
                break;
            }
            case CARGO_ULONGLONG:
            {
                vc->nums[i].ull = va_arg(ap, unsigned long long int);
                cargo_aappendf(&str, "%"CARGO_ULONGLONG_FMT, vc->nums[i].ull);
                break;
            }
            default:
                break;
        }

        if (i + 1 < vc->count)
        {
            cargo_aappendf(&str, ", ");
        }
    }

    va_end(ap);

    return v;
fail:
    _cargo_xfree(&vc->strs);
    _cargo_xfree(&vc->nums);
    _cargo_xfree(&vc->err);
    _cargo_free(vc);
    _cargo_free(v);
    return NULL;
}